

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_CopyHeadingTo_Test::TestBody
          (FileDescriptorTest_CopyHeadingTo_Test *this)

{
  bool bVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  FileOptions *pFVar4;
  DescriptorProto *this_00;
  char *pcVar5;
  string *psVar6;
  RepeatedPtrField<google::protobuf::DescriptorProto> *pRVar7;
  char *in_R9;
  AssertHelper local_708;
  Message local_700;
  FeatureSet *local_6f8;
  FeatureSet *local_6f0;
  undefined1 local_6e8 [8];
  AssertionResult gtest_ar_12;
  AssertHelper local_6b8;
  Message local_6b0;
  bool local_6a1;
  undefined1 local_6a0 [8];
  AssertionResult gtest_ar__1;
  Message local_688;
  undefined1 local_680 [8];
  AssertionResult gtest_ar_11;
  Message local_668;
  Edition local_660;
  Edition local_65c;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_10;
  Message local_640;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_9;
  Message local_620;
  undefined1 local_618 [8];
  AssertionResult gtest_ar_8;
  Message local_600;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_7;
  FileDescriptorProto other_1;
  Message local_4e8;
  void *local_4e0;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_6;
  FileDescriptor *file_1;
  DescriptorPool pool_1;
  Message local_440;
  FeatureSet *local_438;
  FeatureSet *local_430;
  undefined1 local_428 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_3f8;
  Message local_3f0;
  bool local_3e1;
  undefined1 local_3e0 [8];
  AssertionResult gtest_ar_;
  Message local_3c8;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_4;
  Message local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_3;
  Message local_388;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_2;
  Message local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_1;
  FileDescriptorProto other;
  AssertHelper local_250;
  Message local_248;
  void *local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar;
  FileDescriptor *file;
  DescriptorPool pool;
  undefined1 local_198 [8];
  FileDescriptorProto proto;
  FileDescriptorTest_CopyHeadingTo_Test *this_local;
  
  proto.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_198);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_198);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &proto.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,"foo.proto",
             pAVar3);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 2;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_198);
  internal::ArenaStringPtr::Set(&proto.field_0._impl_.name_,"foo.bar.baz",pAVar3);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 4;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_198);
  internal::ArenaStringPtr::Set(&proto.field_0._impl_.package_,"proto3",pAVar3);
  pFVar4 = FileDescriptorProto::mutable_options((FileDescriptorProto *)local_198);
  puVar2 = internal::HasBits<1>::operator[](&(pFVar4->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)pFVar4);
  internal::ArenaStringPtr::Set(&(pFVar4->field_0)._impl_.java_package_,"foo.bar.baz",pAVar3);
  this_00 = FileDescriptorProto::add_message_type((FileDescriptorProto *)local_198);
  puVar2 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  internal::ArenaStringPtr::Set(&(this_00->field_0)._impl_.name_,"Foo",pAVar3);
  DescriptorPool::DescriptorPool((DescriptorPool *)&file);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )DescriptorPool::BuildFile((DescriptorPool *)&file,(FileDescriptorProto *)local_198);
  local_240 = (void *)0x0;
  testing::internal::CmpHelperNE<google::protobuf::FileDescriptor_const*,decltype(nullptr)>
            ((internal *)local_238,"file","nullptr",(FileDescriptor **)&gtest_ar.message_,&local_240
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x225,pcVar5);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  if (bVar1) {
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_1.message_);
    FileDescriptor::CopyHeadingTo
              ((FileDescriptor *)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,(FileDescriptorProto *)&gtest_ar_1.message_);
    psVar6 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar_1.message_);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
              ((EqHelper *)local_360,"other.name()","\"foo.proto\"",psVar6,(char (*) [10])0x1e1d402)
    ;
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
    if (!bVar1) {
      testing::Message::Message(&local_368);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x229,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_368);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_368);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
    psVar6 = FileDescriptorProto::package_abi_cxx11_((FileDescriptorProto *)&gtest_ar_1.message_);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
              ((EqHelper *)local_380,"other.package()","\"foo.bar.baz\"",psVar6,
               (char (*) [12])"foo.bar.baz");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
    if (!bVar1) {
      testing::Message::Message(&local_388);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22a,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_388);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_388);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
    psVar6 = FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)&gtest_ar_1.message_);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
              ((EqHelper *)local_3a0,"other.syntax()","\"proto3\"",psVar6,(char (*) [7])0x1e1edfb);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
    if (!bVar1) {
      testing::Message::Message(&local_3a8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22b,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_3a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
    pFVar4 = FileDescriptorProto::options((FileDescriptorProto *)&gtest_ar_1.message_);
    psVar6 = FileOptions::java_package_abi_cxx11_(pFVar4);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
              ((EqHelper *)local_3c0,"other.options().java_package()","\"foo.bar.baz\"",psVar6,
               (char (*) [12])"foo.bar.baz");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
    if (!bVar1) {
      testing::Message::Message(&local_3c8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22c,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_3c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_3c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
    pRVar7 = FileDescriptorProto::message_type((FileDescriptorProto *)&gtest_ar_1.message_);
    local_3e1 = RepeatedPtrField<google::protobuf::DescriptorProto>::empty(pRVar7);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3e0,&local_3e1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3e0);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_5.message_,(internal *)local_3e0,
                 (AssertionResult *)"other.message_type().empty()","false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22d,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper(&local_3f8);
      std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_3f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3e0);
    pFVar4 = FileDescriptorProto::options((FileDescriptorProto *)&gtest_ar_1.message_);
    local_430 = FileOptions::features(pFVar4);
    local_438 = FeatureSet::default_instance();
    testing::internal::EqHelper::
    Compare<const_google::protobuf::FeatureSet_*,_const_google::protobuf::FeatureSet_*,_nullptr>
              ((EqHelper *)local_428,"&other.options().features()","&FeatureSet::default_instance()"
               ,&local_430,&local_438);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
    if (!bVar1) {
      testing::Message::Message(&local_440);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_428);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&pool_1.feature_set_defaults_spec_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x22e,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&pool_1.feature_set_defaults_spec_,&local_440);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&pool_1.feature_set_defaults_spec_);
      testing::Message::~Message(&local_440);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_428);
    puVar2 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)&proto.super_Message.super_MessageLite._internal_metadata_,0);
    *(byte *)puVar2 = (byte)*puVar2 | 4;
    pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_198);
    internal::ArenaStringPtr::Set(&proto.field_0._impl_.package_,"editions",pAVar3);
    FileDescriptorProto::set_edition((FileDescriptorProto *)local_198,EDITION_2023);
    DescriptorPool::DescriptorPool((DescriptorPool *)&file_1);
    gtest_ar_6.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )DescriptorPool::BuildFile((DescriptorPool *)&file_1,(FileDescriptorProto *)local_198);
    local_4e0 = (void *)0x0;
    testing::internal::CmpHelperNE<google::protobuf::FileDescriptor_const*,decltype(nullptr)>
              ((internal *)local_4d8,"file","nullptr",(FileDescriptor **)&gtest_ar_6.message_,
               &local_4e0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
    if (!bVar1) {
      testing::Message::Message(&local_4e8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)((long)&other_1.field_0 + 0xe0),kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x235,pcVar5);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)((long)&other_1.field_0 + 0xe0),&local_4e8);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)((long)&other_1.field_0 + 0xe0));
      testing::Message::~Message(&local_4e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
    if (bVar1) {
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_7.message_);
      FileDescriptor::CopyHeadingTo
                ((FileDescriptor *)
                 gtest_ar_6.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl,(FileDescriptorProto *)&gtest_ar_7.message_);
      psVar6 = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)&gtest_ar_7.message_);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                ((EqHelper *)local_5f8,"other.name()","\"foo.proto\"",psVar6,
                 (char (*) [10])0x1e1d402);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
      if (!bVar1) {
        testing::Message::Message(&local_600);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x239,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_600);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
        testing::Message::~Message(&local_600);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
      psVar6 = FileDescriptorProto::package_abi_cxx11_((FileDescriptorProto *)&gtest_ar_7.message_);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
                ((EqHelper *)local_618,"other.package()","\"foo.bar.baz\"",psVar6,
                 (char (*) [12])"foo.bar.baz");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
      if (!bVar1) {
        testing::Message::Message(&local_620);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23a,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_620);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
        testing::Message::~Message(&local_620);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
      psVar6 = FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)&gtest_ar_7.message_);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[9],_nullptr>
                ((EqHelper *)local_638,"other.syntax()","\"editions\"",psVar6,
                 (char (*) [9])0x1e19efe);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
      if (!bVar1) {
        testing::Message::Message(&local_640);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23b,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_640)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
        testing::Message::~Message(&local_640);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
      local_65c = FileDescriptorProto::edition((FileDescriptorProto *)&gtest_ar_7.message_);
      local_660 = EDITION_2023;
      testing::internal::EqHelper::
      Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
                ((EqHelper *)local_658,"other.edition()","EDITION_2023",&local_65c,&local_660);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
      if (!bVar1) {
        testing::Message::Message(&local_668);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23c,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_668)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
        testing::Message::~Message(&local_668);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
      pFVar4 = FileDescriptorProto::options((FileDescriptorProto *)&gtest_ar_7.message_);
      psVar6 = FileOptions::java_package_abi_cxx11_(pFVar4);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
                ((EqHelper *)local_680,"other.options().java_package()","\"foo.bar.baz\"",psVar6,
                 (char (*) [12])"foo.bar.baz");
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_680);
      if (!bVar1) {
        testing::Message::Message(&local_688);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_680);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23d,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_688)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_688);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_680);
      pRVar7 = FileDescriptorProto::message_type((FileDescriptorProto *)&gtest_ar_7.message_);
      local_6a1 = RepeatedPtrField<google::protobuf::DescriptorProto>::empty(pRVar7);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_6a0,&local_6a1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6a0);
      if (!bVar1) {
        testing::Message::Message(&local_6b0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_12.message_,(internal *)local_6a0,
                   (AssertionResult *)"other.message_type().empty()","false","true",in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_6b8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23e,pcVar5);
        testing::internal::AssertHelper::operator=(&local_6b8,&local_6b0);
        testing::internal::AssertHelper::~AssertHelper(&local_6b8);
        std::__cxx11::string::~string((string *)&gtest_ar_12.message_);
        testing::Message::~Message(&local_6b0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6a0);
      pFVar4 = FileDescriptorProto::options((FileDescriptorProto *)&gtest_ar_7.message_);
      local_6f0 = FileOptions::features(pFVar4);
      local_6f8 = FeatureSet::default_instance();
      testing::internal::EqHelper::
      Compare<const_google::protobuf::FeatureSet_*,_const_google::protobuf::FeatureSet_*,_nullptr>
                ((EqHelper *)local_6e8,"&other.options().features()",
                 "&FeatureSet::default_instance()",&local_6f0,&local_6f8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e8);
      if (!bVar1) {
        testing::Message::Message(&local_700);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_6e8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_708,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x23f,pcVar5);
        testing::internal::AssertHelper::operator=(&local_708,&local_700);
        testing::internal::AssertHelper::~AssertHelper(&local_708);
        testing::Message::~Message(&local_700);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e8);
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_7.message_);
    }
    DescriptorPool::~DescriptorPool((DescriptorPool *)&file_1);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_1.message_);
  }
  DescriptorPool::~DescriptorPool((DescriptorPool *)&file);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_198);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, CopyHeadingTo) {
  FileDescriptorProto proto;
  proto.set_name("foo.proto");
  proto.set_package("foo.bar.baz");
  proto.set_syntax("proto3");
  proto.mutable_options()->set_java_package("foo.bar.baz");

  // Won't be copied.
  proto.add_message_type()->set_name("Foo");

  DescriptorPool pool;
  const FileDescriptor* file = pool.BuildFile(proto);
  ASSERT_NE(file, nullptr);

  FileDescriptorProto other;
  file->CopyHeadingTo(&other);
  EXPECT_EQ(other.name(), "foo.proto");
  EXPECT_EQ(other.package(), "foo.bar.baz");
  EXPECT_EQ(other.syntax(), "proto3");
  EXPECT_EQ(other.options().java_package(), "foo.bar.baz");
  EXPECT_TRUE(other.message_type().empty());
  EXPECT_EQ(&other.options().features(), &FeatureSet::default_instance());
  {
    proto.set_syntax("editions");
    proto.set_edition(EDITION_2023);

    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_NE(file, nullptr);

    FileDescriptorProto other;
    file->CopyHeadingTo(&other);
    EXPECT_EQ(other.name(), "foo.proto");
    EXPECT_EQ(other.package(), "foo.bar.baz");
    EXPECT_EQ(other.syntax(), "editions");
    EXPECT_EQ(other.edition(), EDITION_2023);
    EXPECT_EQ(other.options().java_package(), "foo.bar.baz");
    EXPECT_TRUE(other.message_type().empty());
    EXPECT_EQ(&other.options().features(), &FeatureSet::default_instance());
  }
}